

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O3

void arm_v7m_cpu_do_interrupt_aarch64(CPUState *cs)

{
  int *piVar1;
  uint *puVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  TranslationBlock *pTVar6;
  bool bVar7;
  _Bool _Var8;
  _Bool _Var9;
  ARMMMUIdx AVar10;
  uint32_t uVar11;
  tcg_target_ulong tVar12;
  tcg_target_ulong tVar13;
  ulong uVar14;
  ulong uVar15;
  TranslationBlock **ppTVar16;
  long lVar17;
  uint uVar18;
  uint32_t addr;
  undefined8 in_R10;
  undefined7 uVar19;
  uint addr_00;
  uint uVar20;
  long lVar21;
  uint uVar22;
  CPUARMState_conflict *pCVar23;
  uint16_t local_62;
  TranslationBlock **local_60;
  uint local_54;
  CPUARMState_conflict *local_50;
  uint local_44;
  ulong local_40;
  undefined8 local_38;
  
  iVar4 = cs->exception_index;
  if (0x15 < iVar4 - 1U) {
switchD_00623c43_caseD_6:
    cpu_abort_aarch64(cs,"Unhandled exception 0x%x\n");
  }
  pCVar23 = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  switch(iVar4) {
  case 1:
    puVar2 = (uint *)((long)cs[1].tb_jmp_cache +
                     (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar2 = *puVar2 | 0x10000;
    break;
  case 2:
  case 5:
  case 7:
  case 0x14:
    break;
  case 3:
  case 4:
    uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c) & 0xf;
    if (uVar18 == 8) {
      uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c);
      if (iVar4 == 3) {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) = uVar18 | 0x100;
      }
      else {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) = uVar18 | 0x8200;
        *(undefined4 *)(cs[1].tb_jmp_cache + 0x577) = *(undefined4 *)(cs[1].tb_jmp_cache + 0x586);
      }
    }
    else if (uVar18 == 0xe) {
      if (iVar4 == 3) {
        uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac);
        if (*(int *)(cs[1].tb_jmp_cache + 0x57c) == 0) {
          uVar18 = uVar18 | 1;
        }
        else {
          uVar18 = uVar18 | 0x10;
        }
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) = uVar18;
      }
      else {
        pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
        *pbVar3 = *pbVar3 | 8;
      }
    }
    else if (uVar18 == 0xf) {
      if (*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0) {
        __assert_fail("!env->v7m.secure",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                      ,0x77e,"_Bool v7m_handle_execute_nsc(ARMCPU *)");
      }
      if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) == 0) {
        __assert_fail("arm_feature(env, ARM_FEATURE_M_SECURITY)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                      ,0x77f,"_Bool v7m_handle_execute_nsc(ARMCPU *)");
      }
      AVar10 = arm_v7m_mmu_idx_for_secstate_aarch64(pCVar23,true);
      _Var8 = v7m_read_half_insn((ARMCPU_conflict1 *)cs,AVar10,
                                 *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2094),&local_62);
      if (_Var8) {
        if ((*(int *)(cs[1].tb_jmp_cache + 0x44f) != 0) && (local_62 == 0xe97f)) {
          _Var8 = v7m_read_half_insn((ARMCPU_conflict1 *)cs,AVar10,
                                     *(int *)((long)cs[1].tb_jmp_cache + 0x2094) + 2,&local_62);
          if (!_Var8) break;
          if (local_62 == 0xe97f) {
            *(byte *)(cs[1].tb_jmp_cache + 0x412) = *(byte *)(cs[1].tb_jmp_cache + 0x412) & 0xfe;
            *(byte *)(cs[1].tb_jmp_cache + 0x572) = *(byte *)(cs[1].tb_jmp_cache + 0x572) & 0xf7;
            switch_v7m_security_state(pCVar23,true);
            *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x227c) = 0;
            piVar1 = (int *)((long)cs[1].tb_jmp_cache + 0x2094);
            *piVar1 = *piVar1 + 4;
            arm_rebuild_hflags_aarch64(pCVar23);
            return;
          }
        }
        pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
        *pbVar3 = *pbVar3 | 1;
      }
    }
    else {
      uVar15 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
      uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + uVar15 * 4 + 0x2b9c);
      if (iVar4 == 3) {
        *(uint *)((long)cs[1].tb_jmp_cache + uVar15 * 4 + 0x2b9c) = uVar18 | 1;
      }
      else {
        *(uint *)((long)cs[1].tb_jmp_cache + uVar15 * 4 + 0x2b9c) = uVar18 | 0x82;
        *(undefined4 *)
         ((long)cs[1].tb_jmp_cache + (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2bb0) =
             *(undefined4 *)(cs[1].tb_jmp_cache + 0x586);
      }
    }
    break;
  default:
    goto switchD_00623c43_caseD_6;
  case 8:
    uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2094);
    if (0xfeffffff < uVar18) {
      return;
    }
    if (uVar18 < 0xfefffffe) {
      __assert_fail("env->regs[15] >= FNC_RETURN_MIN_MAGIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                    ,0x856,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
    }
    if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) == 0) {
      __assert_fail("arm_feature(env, ARM_FEATURE_M_SECURITY)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                    ,0x857,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
    }
    lVar17 = (ulong)((*(uint *)(cs[1].tb_jmp_cache + 0x572) & 2) * 2) + 0xb1c;
    if (*(int *)(cs[1].tb_jmp_cache + 0x579) != 0) {
      lVar17 = 0xb1c;
    }
    lVar21 = 0x34;
    if (*(int *)(cs[1].tb_jmp_cache + 0x57c) != 1) {
      lVar21 = lVar17;
    }
    uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + lVar21 + 0x2058);
    AVar10 = arm_v7m_mmu_idx_for_secstate_aarch64(pCVar23,true);
    tVar12 = helper_le_ldul_mmu_aarch64(pCVar23,(ulong)uVar18,AVar10 & 7,0);
    local_50 = pCVar23;
    tVar13 = helper_le_ldul_mmu_aarch64(pCVar23,(ulong)(uVar18 + 4),AVar10 & 7,0);
    pCVar23 = local_50;
    if ((*(int *)(cs[1].tb_jmp_cache + 0x579) == 0 && (tVar13 & 0x1ff) == 0) ||
       ((*(int *)(cs[1].tb_jmp_cache + 0x579) == 1 && ((tVar13 & 0x1ff) != 0)))) {
      *(uint *)((long)cs[1].tb_jmp_cache + lVar21 + 0x2058) = uVar18 + 8;
      switch_v7m_security_state(local_50,true);
      *(uint *)(cs[1].tb_jmp_cache + 0x579) = (uint)tVar13 & 0x1ff;
      *(uint *)(cs[1].tb_jmp_cache + 0x572) =
           (uint)tVar13 >> 0x11 & 8 | *(uint *)(cs[1].tb_jmp_cache + 0x572) & 0xfffffff7;
      *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x227c) = 0;
      *(uint *)(cs[1].tb_jmp_cache + 0x44f) = (uint)tVar12 & 1;
      *(uint *)((long)cs[1].tb_jmp_cache + 0x2094) = (uint)tVar12 & 0xfffffffe;
      arm_rebuild_hflags_aarch64(pCVar23);
      return;
    }
    puVar2 = (uint *)((long)cs[1].tb_jmp_cache +
                     (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar2 = *puVar2 | 0x40000;
    break;
  case 0x10:
    *(uint *)((long)cs[1].tb_jmp_cache + 0x2094) =
         *(int *)((long)cs[1].tb_jmp_cache + 0x2094) +
         (uint)(*(int *)(cs[1].tb_jmp_cache + 0x44f) == 0) * 2 + 2;
    return;
  case 0x11:
    lVar17 = 1;
    if (*(int *)(cs[1].tb_jmp_cache + 0x587) != 3) {
      lVar17 = (long)*(int *)(cs[1].tb_jmp_cache + 0x57c);
    }
    pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + lVar17 * 4 + 0x2b9e);
    *pbVar3 = *pbVar3 | 8;
    break;
  case 0x12:
    puVar2 = (uint *)((long)cs[1].tb_jmp_cache +
                     (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar2 = *puVar2 | 0x20000;
    break;
  case 0x13:
    puVar2 = (uint *)((long)cs[1].tb_jmp_cache +
                     (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar2 = *puVar2 | 0x100000;
    break;
  case 0x15:
    pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
    *pbVar3 = *pbVar3 | 0x80;
    break;
  case 0x16:
    puVar2 = (uint *)((long)cs[1].tb_jmp_cache +
                     (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c);
    *puVar2 = *puVar2 | 0x1000000;
  }
  uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + 0x208c);
  uVar15 = (ulong)uVar18;
  uVar22 = *(uint *)((long)cs[1].tb_jmp_cache + 0x227c);
  uVar20 = *(int *)((long)cs[1].tb_jmp_cache + 0x2274) << 0x10 |
           (uVar22 & 0xfc) << 8 |
           (uVar22 & 3) << 0x19 |
           *(int *)(cs[1].tb_jmp_cache + 0x44f) << 0x18 |
           *(int *)(cs[1].tb_jmp_cache + 0x44e) << 0x1b |
           *(uint *)((long)cs[1].tb_jmp_cache + 0x2264) >> 3 & 0x10000000 |
           *(int *)(cs[1].tb_jmp_cache + 0x44c) << 0x1d |
           (uint)(*(int *)((long)cs[1].tb_jmp_cache + 0x226c) == 0) << 0x1e |
           *(uint *)(cs[1].tb_jmp_cache + 0x44d) & 0x80000000 |
           *(uint *)(cs[1].tb_jmp_cache + 0x579);
  AVar10 = arm_mmu_idx_aarch64(pCVar23);
  uVar22 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2c24);
  local_38 = 0xffffffe0;
  local_54 = 0x10;
  if (((*(uint *)(cs[1].tb_jmp_cache + 0x572) & 4) != 0) &&
     ((uVar22 & 0x400) != 0 || *(int *)(cs[1].tb_jmp_cache + 0x57c) != 0)) {
    if ((*(int *)(cs[1].tb_jmp_cache + 0x57c) == 0) ||
       ((*(byte *)((long)cs[1].tb_jmp_cache + 0x2c13) & 4) == 0)) {
      local_38 = 0xffffff98;
    }
    else {
      local_38 = 0xffffff58;
      local_54 = 0x20;
    }
  }
  if ((uVar18 & 4) == 0) {
    uVar14 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
  }
  else {
    uVar14 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
    if ((*(byte *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b95) & 2) != 0) {
      uVar15 = (ulong)(uVar18 - 4);
      uVar20 = uVar20 | 0x200;
    }
  }
  uVar18 = (*(uint *)(cs[1].tb_jmp_cache + 0x572) & 8) << 0x11;
  if ((int)uVar14 == 0) {
    uVar18 = 0;
  }
  addr_00 = (int)uVar15 + (int)local_38;
  local_60 = (TranslationBlock **)uVar15;
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508b) & 8) == 0) {
LAB_00624091:
    bVar7 = false;
    _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00,*(uint32_t *)(cs[1].tb_jmp_cache + 0x40b)
                            ,AVar10,STACK_NORMAL);
    _Var9 = false;
    if (_Var8) {
      bVar7 = false;
      _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 4,
                              *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x205c),AVar10,STACK_NORMAL);
      _Var9 = false;
      if (_Var8) {
        bVar7 = false;
        _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 8,
                                *(uint32_t *)(cs[1].tb_jmp_cache + 0x40c),AVar10,STACK_NORMAL);
        _Var9 = false;
        if (_Var8) {
          bVar7 = false;
          _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0xc,
                                  *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2064),AVar10,
                                  STACK_NORMAL);
          _Var9 = false;
          if (_Var8) {
            bVar7 = false;
            _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x10,
                                    *(uint32_t *)(cs[1].tb_jmp_cache + 0x411),AVar10,STACK_NORMAL);
            _Var9 = false;
            if (_Var8) {
              bVar7 = false;
              _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x14,
                                      *(uint32_t *)(cs[1].tb_jmp_cache + 0x412),AVar10,STACK_NORMAL)
              ;
              _Var9 = false;
              if (_Var8) {
                bVar7 = false;
                _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x18,
                                        *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2094),AVar10,
                                        STACK_NORMAL);
                _Var9 = false;
                if (_Var8) {
                  bVar7 = false;
                  _Var9 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x1c,
                                          uVar20 & 0xffefffff | uVar18,AVar10,STACK_NORMAL);
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (*(int *)(cs[1].tb_jmp_cache + 0x579) == 0) {
      lVar17 = (ulong)((*(byte *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b8c) & 2) >> 1) * 8 +
               0xb9c;
    }
    else {
      lVar17 = 0xb9c;
    }
    uVar5 = *(uint *)((long)pCVar23->regs + uVar14 * 4 + lVar17);
    if (uVar5 <= addr_00) goto LAB_00624091;
    pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + uVar14 * 4 + 0x2b9e);
    *pbVar3 = *pbVar3 | 0x10;
    *(uint *)((long)cs[1].tb_jmp_cache + 0x208c) = uVar5;
    bVar7 = true;
    _Var9 = false;
  }
  if (((ulong)cs[1].tb_jmp_cache[0x572] & 4) == 0) goto LAB_00624642;
  if (((*(byte *)((long)cs[1].tb_jmp_cache +
                 (ulong)(*(uint *)(cs[1].tb_jmp_cache + 0x582) & 4) + 0x2c0c) & 1) != 0) &&
     ((*(byte *)((long)cs[1].tb_jmp_cache + 0x508c) & 0x20) != 0)) {
    pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + 0x2bac);
    *pbVar3 = *pbVar3 | 0x80;
    goto LAB_00624642;
  }
  uVar15 = (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c);
  if ((uVar22 & 0x400) == 0 && *(uint *)(cs[1].tb_jmp_cache + 0x57c) == 0) {
    pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + 0x2ba2);
    *pbVar3 = *pbVar3 | 8;
    goto LAB_00624642;
  }
  if ((*(uint *)(cs[1].tb_jmp_cache + 0x582) >> 0x1e & 1) != 0) goto LAB_00624642;
  uVar19 = (undefined7)((ulong)in_R10 >> 8);
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x5089) & 2) != 0) {
    uVar18 = 1;
    if (*(int *)(cs[1].tb_jmp_cache + 0x579) == 0) {
      uVar18 = ~*(uint *)((long)cs[1].tb_jmp_cache + uVar15 * 4 + 0x2b8c) & 1;
      local_44 = (uint)CONCAT71(uVar19,1);
      uVar22 = 0;
      switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar15 != 0) * 4 + 0x2c1c) >> 0x14 & 3) {
      default:
        goto switchD_006242a7_caseD_0;
      case 1:
        goto switchD_006242a7_caseD_1;
      case 3:
        goto switchD_006242a7_caseD_3;
      }
    }
    goto LAB_00624482;
  }
  if (*(int *)((long)cs[1].tb_jmp_cache + 0x21a4) != 0) {
    uVar18 = *(uint *)(cs[1].tb_jmp_cache + 0x434) >> 2 & 3;
    local_44 = (uint)CONCAT71(uVar19,1);
    uVar22 = 0;
    switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar15 != 0) * 4 + 0x2c1c) >> 0x14 & 3) {
    default:
      goto switchD_006242a7_caseD_0;
    case 1:
      goto switchD_006242a7_caseD_1;
    case 3:
      goto switchD_006242a7_caseD_3;
    }
  }
  uVar18 = *(uint *)((long)cs[1].tb_jmp_cache + 0x21ac) & 0x1f;
  if (uVar18 == 0x10) {
    uVar18 = 0;
LAB_00624482:
    local_44 = (uint)CONCAT71(uVar19,1);
    uVar22 = 0;
    switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar15 != 0) * 4 + 0x2c1c) >> 0x14 & 3) {
    case 1:
switchD_006242a7_caseD_1:
      uVar22 = (uint)(uVar18 != 0);
    default:
switchD_006242a7_caseD_0:
      local_44 = uVar22;
      if ((_Var9 != false) && ((char)local_44 == '\0')) {
        pbVar3 = (byte *)((long)cs[1].tb_jmp_cache + uVar15 * 4 + 0x2b9e);
        *pbVar3 = *pbVar3 | 8;
        local_44 = 0;
        _Var9 = false;
      }
    case 3:
switchD_006242a7_caseD_3:
      uVar22 = 0;
      uVar18 = 0;
      uVar11 = (int)local_38 + (int)local_60 + 0x20;
      local_60 = cs[1].tb_jmp_cache + 0x58d;
      local_50 = pCVar23;
      local_40 = (ulong)addr_00;
      do {
        addr = uVar11;
        if (0xf < uVar18) {
          addr = uVar11 + 8;
        }
        if (_Var9 == false) {
          _Var9 = false;
        }
        else {
          pTVar6 = local_60[(ulong)(uVar18 >> 2) * 0x20 + (ulong)(uVar22 & 1)];
          _Var8 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr,(uint32_t)pTVar6,AVar10,STACK_NORMAL);
          _Var9 = false;
          if (_Var8) {
            _Var9 = v7m_stack_write((ARMCPU_conflict1 *)cs,addr + 4,
                                    (uint32_t)((ulong)pTVar6 >> 0x20),AVar10,STACK_NORMAL);
          }
        }
        pCVar23 = local_50;
        uVar18 = uVar18 + 2;
        uVar22 = uVar22 + 1;
        uVar11 = uVar11 + 8;
      } while (uVar18 < local_54);
      addr_00 = (uint)local_40;
      if (_Var9 != false) {
        uVar11 = vfp_get_fpscr_aarch64(local_50);
        v7m_stack_write((ARMCPU_conflict1 *)cs,addr_00 + 0x60,uVar11,AVar10,STACK_NORMAL);
      }
      if ((char)local_44 != '\0') {
        uVar18 = local_54 - 1 >> 1;
        ppTVar16 = cs[1].tb_jmp_cache + 0x58e;
        uVar22 = 0;
        do {
          if ((bool)(~((int)(uVar18 ^ 0x80000000) < (int)(uVar22 ^ 0x80000000)) & 1)) {
            ppTVar16[-1] = (TranslationBlock *)0x0;
          }
          if ((int)((uVar22 | 1) ^ 0x80000000) <= (int)(uVar18 ^ 0x80000000)) {
            *ppTVar16 = (TranslationBlock *)0x0;
          }
          ppTVar16 = ppTVar16 + 0x20;
          uVar20 = uVar22 + 1;
          uVar22 = uVar22 + 2;
        } while (uVar20 != uVar18);
        vfp_set_fpscr_aarch64(pCVar23,0);
      }
LAB_00624642:
      if (!bVar7) {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x208c) = addr_00;
      }
      return;
    }
  }
  if (uVar18 != 0x16) {
    if (uVar18 == 0x1a) {
      uVar18 = 1;
      local_44 = (uint)CONCAT71(uVar19,1);
      uVar22 = 0;
      switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar15 != 0) * 4 + 0x2c1c) >> 0x14 & 3) {
      default:
        goto switchD_006242a7_caseD_0;
      case 1:
        goto switchD_006242a7_caseD_1;
      case 3:
        goto switchD_006242a7_caseD_3;
      }
    }
    uVar18 = 1;
    goto LAB_00624482;
  }
  uVar18 = 1;
  local_44 = (uint)CONCAT71(uVar19,1);
  uVar22 = 0;
  switch(*(uint *)((long)cs[1].tb_jmp_cache + (ulong)(uVar15 != 0) * 4 + 0x2c1c) >> 0x14 & 3) {
  default:
    goto switchD_006242a7_caseD_0;
  case 1:
    goto switchD_006242a7_caseD_1;
  case 3:
    goto switchD_006242a7_caseD_3;
  }
}

Assistant:

void arm_v7m_cpu_do_interrupt(CPUState *cs)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    uint32_t lr;
    bool ignore_stackfaults;

    // arm_log_exception(cs->exception_index);

    /*
     * For exceptions we just mark as pending on the NVIC, and let that
     * handle it.
     */
    switch (cs->exception_index) {
    case EXCP_UDEF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNDEFINSTR_MASK;
        break;
    case EXCP_NOCP:
    {
        /*
         * NOCP might be directed to something other than the current
         * security state if this fault is because of NSACR; we indicate
         * the target security state using exception.target_el.
         */
        int target_secstate;

        if (env->exception.target_el == 3) {
            target_secstate = M_REG_S;
        } else {
            target_secstate = env->v7m.secure;
        }
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, target_secstate);
        env->v7m.cfsr[target_secstate] |= R_V7M_CFSR_NOCP_MASK;
        break;
    }
    case EXCP_INVSTATE:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_INVSTATE_MASK;
        break;
    case EXCP_STKOF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_STKOF_MASK;
        break;
    case EXCP_LSERR:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
        env->v7m.sfsr |= R_V7M_SFSR_LSERR_MASK;
        break;
    case EXCP_UNALIGNED:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNALIGNED_MASK;
        break;
    case EXCP_SWI:
        /* The PC already points to the next instruction.  */
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SVC, env->v7m.secure);
        break;
    case EXCP_PREFETCH_ABORT:
    case EXCP_DATA_ABORT:
        /*
         * Note that for M profile we don't have a guest facing FSR, but
         * the env->exception.fsr will be populated by the code that
         * raises the fault, in the A profile short-descriptor format.
         */
        switch (env->exception.fsr & 0xf) {
        case M_FAKE_FSR_NSC_EXEC:
            /*
             * Exception generated when we try to execute code at an address
             * which is marked as Secure & Non-Secure Callable and the CPU
             * is in the Non-Secure state. The only instruction which can
             * be executed like this is SG (and that only if both halves of
             * the SG instruction have the same security attributes.)
             * Everything else must generate an INVEP SecureFault, so we
             * emulate the SG instruction here.
             */
            if (v7m_handle_execute_nsc(cpu)) {
                return;
            }
            break;
        case M_FAKE_FSR_SFAULT:
            /*
             * Various flavours of SecureFault for attempts to execute or
             * access data in the wrong security state.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                if (env->v7m.secure) {
                    env->v7m.sfsr |= R_V7M_SFSR_INVTRAN_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVTRAN\n");
                } else {
                    env->v7m.sfsr |= R_V7M_SFSR_INVEP_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVEP\n");
                }
                break;
            case EXCP_DATA_ABORT:
                /* This must be an NS access to S memory */
                env->v7m.sfsr |= R_V7M_SFSR_AUVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT,
                              "...really SecureFault with SFSR.AUVIOL\n");
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
            break;
        case 0x8: /* External Abort */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[M_REG_NS] |= R_V7M_CFSR_IBUSERR_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IBUSERR\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[M_REG_NS] |=
                    (R_V7M_CFSR_PRECISERR_MASK | R_V7M_CFSR_BFARVALID_MASK);
                env->v7m.bfar = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.PRECISERR and BFAR 0x%x\n",
                              env->v7m.bfar);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_BUS, false);
            break;
        default:
            /*
             * All other FSR values are either MPU faults or "can't happen
             * for M profile" cases.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_IACCVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IACCVIOL\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[env->v7m.secure] |=
                    (R_V7M_CFSR_DACCVIOL_MASK | R_V7M_CFSR_MMARVALID_MASK);
                env->v7m.mmfar[env->v7m.secure] = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.DACCVIOL and MMFAR 0x%x\n",
                              env->v7m.mmfar[env->v7m.secure]);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_MEM,
                                    env->v7m.secure);
            break;
        }
        break;
    case EXCP_SEMIHOST:
        qemu_log_mask(CPU_LOG_INT,
                      "...handling as semihosting call 0x%x\n",
                      env->regs[0]);
        // env->regs[0] = do_arm_semihosting(env); FIXME
        env->regs[15] += env->thumb ? 2 : 4;
        return;
    case EXCP_BKPT:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_DEBUG, false);
        break;
    case EXCP_IRQ:
        break;
    case EXCP_EXCEPTION_EXIT:
        if (env->regs[15] < EXC_RETURN_MIN_MAGIC) {
            /* Must be v8M security extension function return */
            assert(env->regs[15] >= FNC_RETURN_MIN_MAGIC);
            assert(arm_feature(env, ARM_FEATURE_M_SECURITY));
            if (do_v7m_function_return(cpu)) {
                return;
            }
        } else {
            do_v7m_exception_exit(cpu);
            return;
        }
        break;
    case EXCP_LAZYFP:
        /*
         * We already pended the specific exception in the NVIC in the
         * v7m_preserve_fp_state() helper function.
         */
        break;
    default:
        cpu_abort(cs, "Unhandled exception 0x%x\n", cs->exception_index);
        return; /* Never happens.  Keep compiler happy.  */
    }

    if (arm_feature(env, ARM_FEATURE_V8)) {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_DCRS_MASK;
        /*
         * The S bit indicates whether we should return to Secure
         * or NonSecure (ie our current state).
         * The ES bit indicates whether we're taking this exception
         * to Secure or NonSecure (ie our target state). We set it
         * later, in v7m_exception_taken().
         * The SPSEL bit is also set in v7m_exception_taken() for v8M.
         * This corresponds to the ARM ARM pseudocode for v8M setting
         * some LR bits in PushStack() and some in ExceptionTaken();
         * the distinction matters for the tailchain cases where we
         * can take an exception without pushing the stack.
         */
        if (env->v7m.secure) {
            lr |= R_V7M_EXCRET_S_MASK;
        }
    } else {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_S_MASK |
            R_V7M_EXCRET_DCRS_MASK |
            R_V7M_EXCRET_ES_MASK;
        if (env->v7m.control[M_REG_NS] & R_V7M_CONTROL_SPSEL_MASK) {
            lr |= R_V7M_EXCRET_SPSEL_MASK;
        }
    }
    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_FPCA_MASK)) {
        lr |= R_V7M_EXCRET_FTYPE_MASK;
    }
    if (!arm_v7m_is_handler_mode(env)) {
        lr |= R_V7M_EXCRET_MODE_MASK;
    }

    ignore_stackfaults = v7m_push_stack(cpu);
    v7m_exception_taken(cpu, lr, false, ignore_stackfaults);
}